

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description_is_supported
          (Impl *this,VkSubpassDescription *sub)

{
  bool bVar1;
  uint local_28;
  uint local_24;
  uint32_t j_1;
  uint32_t j;
  VkSubpassDescription *sub_local;
  Impl *this_local;
  
  bVar1 = subpass_description_flags_is_supported(this,sub->flags);
  if (bVar1) {
    for (local_24 = 0; local_24 < sub->colorAttachmentCount; local_24 = local_24 + 1) {
      bVar1 = attachment_reference_is_supported(this,sub->pColorAttachments + local_24);
      if (!bVar1) {
        return false;
      }
      if ((sub->pResolveAttachments != (VkAttachmentReference *)0x0) &&
         (bVar1 = attachment_reference_is_supported(this,sub->pResolveAttachments + local_24),
         !bVar1)) {
        return false;
      }
    }
    for (local_28 = 0; local_28 < sub->inputAttachmentCount; local_28 = local_28 + 1) {
      bVar1 = attachment_reference_is_supported(this,sub->pInputAttachments + local_28);
      if (!bVar1) {
        return false;
      }
    }
    if ((sub->pDepthStencilAttachment != (VkAttachmentReference *)0x0) &&
       (bVar1 = attachment_reference_is_supported(this,sub->pDepthStencilAttachment), !bVar1)) {
      return false;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::subpass_description_is_supported(const VkSubpassDescription &sub) const
{
	if (!subpass_description_flags_is_supported(sub.flags))
		return false;

	for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
	{
		if (!attachment_reference_is_supported(sub.pColorAttachments[j]))
			return false;
		if (sub.pResolveAttachments && !attachment_reference_is_supported(sub.pResolveAttachments[j]))
			return false;
	}

	for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
		if (!attachment_reference_is_supported(sub.pInputAttachments[j]))
			return false;

	if (sub.pDepthStencilAttachment && !attachment_reference_is_supported(*sub.pDepthStencilAttachment))
		return false;

	return true;
}